

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O1

void __thiscall
MedianFilterCV_8U::setSourceImage(MedianFilterCV_8U *this,uchar **matrix,int rows,int cols)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  Mat *pMVar4;
  ulong uVar5;
  ulong uVar6;
  
  pMVar4 = this->sourceImage;
  if (pMVar4 != (Mat *)0x0) {
    cv::Mat::~Mat(pMVar4);
    operator_delete(pMVar4,0x60);
  }
  pMVar4 = (Mat *)operator_new(0x60);
  cv::Mat::Mat(pMVar4,rows,cols,0);
  this->sourceImage = pMVar4;
  if (0 < rows) {
    uVar5 = 0;
    do {
      if (0 < cols) {
        puVar1 = matrix[uVar5];
        lVar2 = **(long **)(pMVar4 + 0x48);
        lVar3 = *(long *)(pMVar4 + 0x10);
        uVar6 = 0;
        do {
          *(ushort *)(lVar2 * uVar5 + lVar3 + uVar6 * 2) = (ushort)puVar1[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uint)cols != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)rows);
  }
  return;
}

Assistant:

void MedianFilterCV_8U::setSourceImage(const uchar **matrix, int rows, int cols) {
    delete sourceImage;

    sourceImage = new cv::Mat(rows, cols, CV_8U);
    for (int i = 0; i < rows; ++i) {
        for (int j = 0; j < cols; ++j) {
            sourceImage->at<ushort>(i, j) = matrix[i][j];
        }
    }
}